

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsfil.cpp
# Opt level: O0

int __thiscall CTcSymObjBase::write_to_obj_file(CTcSymObjBase *this,CVmFile *fp)

{
  long in_RDI;
  CVmFile *in_stack_00000048;
  CTcSymObjBase *in_stack_00000050;
  undefined4 local_4;
  
  if ((((*(ushort *)(in_RDI + 0xb8) & 1) == 0) || ((*(ushort *)(in_RDI + 0xb8) >> 1 & 1) != 0)) &&
     ((*(ushort *)(in_RDI + 0xb8) >> 4 & 1) == 0)) {
    if ((*(ushort *)(in_RDI + 0xb8) >> 6 & 1) == 0) {
      local_4 = write_to_obj_file_main(in_stack_00000050,in_stack_00000048);
    }
    else if ((*(ushort *)(in_RDI + 0xb8) >> 7 & 1) == 0) {
      *(ushort *)(in_RDI + 0xb8) = *(ushort *)(in_RDI + 0xb8) & 0xff7f | 0x80;
      local_4 = 1;
    }
    else {
      local_4 = 0;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int CTcSymObjBase::write_to_obj_file(CVmFile *fp)
{
    /* 
     *   If the object is external and has never been referenced, don't
     *   bother writing it.
     *   
     *   In addition, if the object is marked as modified, don't write it.
     *   We write modified base objects specially, because we must control
     *   the order in which a modified base object is written relative its
     *   modifying object.  
     */
    if ((is_extern_ && !ref_) || modified_)
        return FALSE;

    /* if the object has already been written, don't write it again */
    if (written_to_obj_)
    {
        /* 
         *   if we've never been counted in the object file before, we must
         *   have been written indirectly in the course of writing another
         *   symbol - in this case, return true to indicate that we are in
         *   the file, even though we're not actually writing anything now 
         */
        if (!counted_in_obj_)
        {
            /* we've now been counted in the object file */
            counted_in_obj_ = TRUE;

            /* indicate that we have been written */
            return TRUE;
        }
        else
        {
            /* we've already been written and counted - don't write again */
            return FALSE;
        }
    }

    /* do the main part of the writing */
    return write_to_obj_file_main(fp);
}